

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

vector<Scope,_std::allocator<Scope>_> * __thiscall
TreeIncPruneBGPlanner::GetValidActions
          (vector<Scope,_std::allocator<Scope>_> *__return_storage_ptr__,TreeIncPruneBGPlanner *this
          ,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  PlanningUnitDecPOMDPDiscrete *pPVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint local_7c;
  vector<Scope,_std::allocator<Scope>_> *local_78;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_70;
  Scope aI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  
  pvVar1 = (jpol->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (jpol->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = jpol;
  GetObservationsFromDepth(&Os,this,depth);
  (__return_storage_ptr__->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Scope,_std::allocator<Scope>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = __return_storage_ptr__;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, ((long)pvVar1 - (long)pvVar2) / 0x18 != uVar7;
      uVar6 = uVar6 + 1) {
    aI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    aI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    aI.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar3 = *(long *)&(local_70->
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar7].
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data;
    if (*(int *)(lVar3 + (ulong)Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar7] * 4) == -1) {
      uVar8 = 0;
      while( true ) {
        pPVar5 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning._m_pu
        ;
        if (pPVar5 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
          pPVar5 = (this->super_MonahanBGPlanner).super_MonahanPlanner.super_AlphaVectorPlanning.
                   _m_puShared.px;
        }
        local_7c = uVar8;
        iVar4 = (*(pPVar5->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[7])
                          (pPVar5,uVar7);
        __return_storage_ptr__ = local_78;
        if (CONCAT44(extraout_var,iVar4) == (ulong)uVar8) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aI,&local_7c);
        uVar8 = local_7c + 1;
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aI,
                 (value_type_conflict1 *)
                 (lVar3 + (ulong)Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar7] * 4));
    }
    std::vector<Scope,_std::allocator<Scope>_>::push_back(__return_storage_ptr__,(value_type *)&aI);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&aI);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<Scope> TreeIncPruneBGPlanner::GetValidActions(
    Index depth,
    const vector<vector<Index> > &jpol) const
{
    size_t nrAgents=jpol.size();

    vector<Index> Os=GetObservationsFromDepth(depth);
    vector<Scope> as;
    for(Index k=0;k!=nrAgents;++k)
    {
        Scope aI;
        if(jpol[k][Os[k]]==UNSPECIFIED_ACTION)
            // we didn't specify this obs yet, so all actions are valid
            for(Index a=0;a!=GetPU()->GetNrActions(k);++a)
                aI.push_back(a);
        else // we already assigned this obs, so we can only use that
             // particular action
            aI.push_back(jpol[k][Os[k]]);
        as.push_back(aI);
    }

    return(as);
}